

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * findInPath(QString *__return_storage_ptr__,QString *fileName)

{
  char cVar1;
  qsizetype *pqVar2;
  long lVar3;
  long in_FS_OFFSET;
  QFileInfo fileInfo;
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.size = -0x5555555555555556;
  local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_88.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_a8);
  QString::fromLocal8Bit<void>((QString *)&local_88,(QByteArray *)&local_a8);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
  local_a8.size = -0x5555555555555556;
  local_a8.d._0_4_ = 0xaaaaaaaa;
  local_a8.d._4_4_ = 0xaaaaaaaa;
  local_a8.ptr._0_4_ = 0xaaaaaaaa;
  local_a8.ptr._4_4_ = 0xaaaaaaaa;
  QString::split(&local_a8,&local_88,0x3a,0,1);
  lVar3 = local_a8.size * 0x18;
  pqVar2 = (qsizetype *)CONCAT44(local_a8.ptr._4_4_,local_a8.ptr._0_4_);
  do {
    if (lVar3 == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_0011a650:
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    _fileInfo = 0xaaaaaaaaaaaaaaaa;
    local_68.a.b = L'/';
    local_68.a.a = (QString *)pqVar2;
    local_68.b = fileName;
    QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
              ((QString *)&local_50,&local_68);
    QFileInfo::QFileInfo(&fileInfo,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      cVar1 = QFileInfo::isFile();
      if (cVar1 != '\0') {
        cVar1 = QFileInfo::isExecutable();
        if (cVar1 != '\0') {
          local_50.ptr._0_2_ = 0x2f;
          local_50.d = (Data *)pqVar2;
          local_50.size = (qsizetype)fileName;
          QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::
          convertTo<QString>(__return_storage_ptr__,
                             (QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>
                              *)&local_50);
          QFileInfo::~QFileInfo(&fileInfo);
          goto LAB_0011a650;
        }
      }
    }
    QFileInfo::~QFileInfo(&fileInfo);
    pqVar2 = pqVar2 + 3;
    lVar3 = lVar3 + -0x18;
  } while( true );
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QFileInfo fileInfo(path + u'/' + fileName);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return path + u'/' + fileName;
    }

    return QString();
}